

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O2

void __thiscall proto3_unittest::TestHasbits::~TestHasbits(TestHasbits *this)

{
  ~TestHasbits(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

TestHasbits::~TestHasbits() {
  // @@protoc_insertion_point(destructor:proto3_unittest.TestHasbits)
  SharedDtor(*this);
}